

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

bool __thiscall Loader::setWREN(Loader *this)

{
  bool bVar1;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  Loader local_38 [2];
  Loader *local_18;
  Loader *this_local;
  
  local_18 = this;
  bVar1 = setIR(this,USER1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"06",&local_59);
    reverseBytes(local_38,(string *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"",&local_b9);
    bVar1 = shiftDR(this,8,(string *)local_38,(string *)local_90,(string *)local_b8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Loader::setWREN() {
	if (!setIR(USER1))
		return false;
	if (!shiftDR(8, reverseBytes("06"), "", ""))
		return false;
	return true;
}